

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseEditBackspace(linenoiseState *l)

{
  size_t sVar1;
  
  sVar1 = l->pos;
  if ((sVar1 != 0) && (l->len != 0)) {
    memmove(l->buf + (sVar1 - 1),l->buf + sVar1,l->len - sVar1);
    l->pos = l->pos - 1;
    sVar1 = l->len;
    l->len = sVar1 - 1;
    l->buf[sVar1 - 1] = '\0';
    linenoiseRefreshLine();
    return;
  }
  return;
}

Assistant:

void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        memmove(l->buf+l->pos-1,l->buf+l->pos,l->len-l->pos);
        l->pos--;
        l->len--;
        l->buf[l->len] = '\0';
        linenoiseRefreshLine();
    }
}